

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

void __thiscall vera::Shader::use(Shader *this)

{
  bool bVar1;
  
  if (((this->m_program == 0) || (this->m_needsReloading != false)) ||
     ((this->super_HaveDefines).m_defineChange == true)) {
    load(this,&this->m_fragmentSource,&this->m_vertexSource,this->m_error_screen,false);
  }
  bVar1 = inUse(this);
  if (!bVar1) {
    glUseProgram(this->m_program);
  }
  this->textureIndex = 0;
  return;
}

Assistant:

void Shader::use() {
    if (isDirty())
        load(m_fragmentSource, m_vertexSource, m_error_screen, false);

    if (!inUse())
        glUseProgram(getProgram());
        
    textureIndex = 0;
}